

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O2

void __thiscall tcu::x11::glx::Rank::add(Rank *this,size_t bits,deUint32 value)

{
  InternalError *this_00;
  uint uVar1;
  ulong uVar2;
  
  if (bits <= this->m_bitsLeft) {
    this->m_bitsLeft = this->m_bitsLeft - bits;
    uVar1 = ~(-1 << ((byte)bits & 0x1f));
    uVar2 = (ulong)uVar1;
    if (value <= uVar1) {
      uVar2 = (ulong)value;
    }
    this->m_value = uVar2 | this->m_value << ((byte)bits & 0x3f);
    return;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this_00,(char *)0x0,"m_bitsLeft >= bits",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
             ,0x202);
  __cxa_throw(this_00,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

void Rank::add (size_t bits, deUint32 value)
{
	TCU_CHECK_INTERNAL(m_bitsLeft >= bits);
	m_bitsLeft -= bits;
	m_value = m_value << bits | de::min((1U << bits) - 1, value);
}